

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  long lVar12;
  int iVar13;
  ulong size;
  ulong uVar14;
  long lVar15;
  __m128i *palVar16;
  long lVar17;
  uint uVar18;
  __m128i *palVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar31;
  uint uVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar33;
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar39;
  uint uVar40;
  undefined1 auVar38 [16];
  uint uVar41;
  uint uVar42;
  uint uVar44;
  uint uVar45;
  undefined1 auVar43 [16];
  uint uVar46;
  int iVar47;
  uint uVar50;
  int iVar51;
  uint uVar52;
  undefined1 auVar49 [16];
  int iVar53;
  uint uVar54;
  uint uVar55;
  uint uVar58;
  uint uVar60;
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  int iVar59;
  int iVar61;
  uint uVar62;
  int iVar63;
  undefined1 auVar57 [16];
  int iVar64;
  int iVar66;
  int iVar67;
  undefined1 in_XMM9 [16];
  undefined1 auVar65 [16];
  int iVar68;
  __m128i alVar69;
  undefined1 in_XMM11 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar71 [16];
  int32_t iVar48;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar24 = profile->s1Len;
        if ((int)uVar24 < 1) {
          parasail_nw_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar36 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            uVar22 = uVar24 - 1;
            size = (ulong)uVar24 + 3 >> 2;
            uVar35 = (ulong)uVar22 % size;
            iVar23 = -open;
            iVar13 = ppVar5->min;
            uVar18 = 0x80000000 - iVar13;
            if (iVar13 != iVar23 && SBORROW4(iVar13,iVar23) == iVar13 + open < 0) {
              uVar18 = open | 0x80000000;
            }
            uVar7 = 0x7ffffffe - ppVar5->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar24 + 3) & 0x7ffffffc,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              iVar13 = (int)(uVar22 / size);
              ppVar10->flag = ppVar10->flag | 0x4420801;
              palVar11 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar11 != (__m128i *)0x0)) {
                iVar8 = s2Len + -1;
                iVar9 = 3 - iVar13;
                uVar18 = uVar18 + 1;
                auVar38._4_4_ = iVar23;
                auVar38._0_4_ = iVar23;
                auVar38._8_4_ = iVar23;
                auVar38._12_4_ = iVar23;
                auVar43._0_8_ = CONCAT44(0,open);
                auVar43._8_4_ = open;
                auVar43._12_4_ = 0;
                auVar49._8_4_ = (int)size;
                auVar49._0_8_ = size;
                auVar49._12_4_ = 0;
                auVar56 = pmovsxbq(in_XMM8,0x302);
                auVar56 = pmuldq(auVar56,auVar49);
                auVar49 = pmuldq(auVar49,_DAT_00903a90);
                uVar14 = 0;
                auVar65 = pmovsxdq(in_XMM9,0x8000000080000000);
                palVar16 = palVar11;
                palVar19 = ptr_00;
                do {
                  auVar71._8_4_ = (int)uVar14;
                  auVar71._0_8_ = uVar14;
                  auVar71._12_4_ = (int)(uVar14 >> 0x20);
                  auVar25._0_4_ = (undefined4)(uVar14 + auVar49._0_8_);
                  auVar25._4_4_ = (int)(auVar71._8_8_ + auVar49._8_8_);
                  auVar25._8_4_ = (int)(auVar56._0_8_ + uVar14);
                  auVar25._12_4_ = (int)(auVar56._8_8_ + auVar71._8_8_);
                  auVar26._4_4_ = gap;
                  auVar26._0_4_ = gap;
                  auVar26._8_4_ = gap;
                  auVar26._12_4_ = gap;
                  auVar26 = pmulld(auVar25,auVar26);
                  alVar69[0]._0_4_ = iVar23 - auVar26._0_4_;
                  alVar69[0]._4_4_ = iVar23 - auVar26._4_4_;
                  alVar69[1]._0_4_ = iVar23 - auVar26._8_4_;
                  alVar69[1]._4_4_ = iVar23 - auVar26._12_4_;
                  auVar26 = pmovsxdq(in_XMM11,(undefined1  [16])alVar69);
                  auVar27._4_4_ = alVar69[1]._4_4_;
                  auVar27._0_4_ = (int)alVar69[1];
                  auVar27._8_4_ = (int)alVar69[1];
                  auVar27._12_4_ = alVar69[1]._4_4_;
                  auVar71 = pmovsxdq(in_XMM12,auVar27);
                  in_XMM12._0_8_ = auVar71._0_8_ - auVar43._0_8_;
                  in_XMM12._8_8_ = auVar71._8_8_ - (ulong)(uint)open;
                  auVar70._0_8_ = auVar26._0_8_ - auVar43._0_8_;
                  auVar70._8_8_ = auVar26._8_8_ - (ulong)(uint)open;
                  auVar28._0_8_ = -(ulong)(auVar65._0_8_ < auVar70._0_8_);
                  auVar28._8_8_ = -(ulong)(auVar65._8_8_ < auVar70._8_8_);
                  auVar26 = blendvpd(auVar65,auVar70,auVar28);
                  auVar29._0_8_ = -(ulong)(auVar65._0_8_ < in_XMM12._0_8_);
                  auVar29._8_8_ = -(ulong)(auVar65._8_8_ < in_XMM12._8_8_);
                  in_XMM11 = blendvpd(auVar65,in_XMM12,auVar29);
                  *palVar16 = alVar69;
                  *(int *)*palVar19 = auVar26._0_4_;
                  *(int *)((long)*palVar19 + 4) = auVar26._8_4_;
                  *(int *)(*palVar19 + 1) = in_XMM11._0_4_;
                  *(int *)((long)*palVar19 + 0xc) = in_XMM11._8_4_;
                  uVar14 = uVar14 + 1;
                  palVar19 = palVar19 + 1;
                  palVar16 = palVar16 + 1;
                } while (size != uVar14);
                *ptr_01 = 0;
                auVar49 = _DAT_00906ca0;
                lVar12 = uVar36 - 1;
                auVar56._8_4_ = (int)lVar12;
                auVar56._0_8_ = lVar12;
                auVar56._12_4_ = (int)((ulong)lVar12 >> 0x20);
                uVar14 = 0;
                auVar38 = pmovsxbq(auVar38,0x302);
                auVar43 = pmovsxbq(auVar43,0x100);
                auVar56 = auVar56 ^ _DAT_00906ca0;
                do {
                  uVar6 = auVar49._0_8_;
                  lVar12 = auVar56._0_8_;
                  if ((bool)(~(lVar12 < (long)(uVar14 ^ uVar6)) & 1)) {
                    ptr_01[uVar14 + 1] = iVar23;
                  }
                  auVar65._8_4_ = (int)uVar14;
                  auVar65._0_8_ = uVar14;
                  auVar65._12_4_ = (int)(uVar14 >> 0x20);
                  if ((long)((auVar65._8_8_ | auVar43._8_8_) ^ auVar49._8_8_) <= auVar56._8_8_) {
                    ptr_01[uVar14 + 2] = iVar23 - gap;
                  }
                  if ((long)((uVar14 | auVar38._0_8_) ^ uVar6) <= lVar12) {
                    ptr_01[uVar14 + 3] = gap * -2 + iVar23;
                    ptr_01[uVar14 + 4] = gap * -3 + iVar23;
                  }
                  uVar14 = uVar14 + 4;
                  iVar23 = iVar23 + gap * -4;
                } while ((s2Len + 3U & 0xfffffffc) != uVar14);
                lVar21 = size * uVar36;
                lVar12 = 0;
                uVar14 = 0;
                uVar24 = uVar18;
                uVar31 = uVar18;
                uVar32 = uVar18;
                uVar33 = uVar18;
                uVar37 = uVar7;
                uVar39 = uVar7;
                uVar40 = uVar7;
                uVar41 = uVar7;
                do {
                  palVar16 = ptr;
                  ptr = palVar11;
                  iVar3 = ppVar5->mapper[(byte)s2[uVar14]];
                  palVar11 = ptr + ((int)size - 1);
                  iVar23 = (int)(*palVar11)[0];
                  iVar51 = *(int *)((long)*palVar11 + 4);
                  iVar53 = (int)(*palVar11)[1];
                  iVar48 = ptr_01[uVar14];
                  lVar17 = 0;
                  lVar15 = lVar12;
                  uVar42 = uVar18;
                  uVar44 = uVar18;
                  uVar45 = uVar18;
                  uVar46 = uVar18;
                  do {
                    piVar1 = (int *)((long)pvVar4 + lVar17 + (long)iVar3 * size * 0x10);
                    iVar47 = iVar48 + *piVar1;
                    iVar23 = iVar23 + piVar1[1];
                    iVar51 = iVar51 + piVar1[2];
                    iVar53 = iVar53 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar17);
                    iVar64 = *piVar1;
                    iVar66 = piVar1[1];
                    iVar67 = piVar1[2];
                    iVar68 = piVar1[3];
                    uVar55 = (iVar64 < (int)uVar42) * uVar42 |
                             (uint)(iVar64 >= (int)uVar42) * iVar64;
                    uVar58 = (iVar66 < (int)uVar44) * uVar44 |
                             (uint)(iVar66 >= (int)uVar44) * iVar66;
                    uVar60 = (iVar67 < (int)uVar45) * uVar45 |
                             (uint)(iVar67 >= (int)uVar45) * iVar67;
                    uVar62 = (iVar68 < (int)uVar46) * uVar46 |
                             (uint)(iVar68 >= (int)uVar46) * iVar68;
                    uVar55 = (uint)((int)uVar55 < iVar47) * iVar47 |
                             ((int)uVar55 >= iVar47) * uVar55;
                    uVar58 = (uint)((int)uVar58 < iVar23) * iVar23 |
                             ((int)uVar58 >= iVar23) * uVar58;
                    uVar60 = (uint)((int)uVar60 < iVar51) * iVar51 |
                             ((int)uVar60 >= iVar51) * uVar60;
                    uVar62 = (uint)((int)uVar62 < iVar53) * iVar53 |
                             ((int)uVar62 >= iVar53) * uVar62;
                    puVar2 = (uint *)((long)*palVar16 + lVar17);
                    *puVar2 = uVar55;
                    puVar2[1] = uVar58;
                    puVar2[2] = uVar60;
                    puVar2[3] = uVar62;
                    uVar24 = ((int)uVar24 < (int)uVar55) * uVar55 |
                             ((int)uVar24 >= (int)uVar55) * uVar24;
                    uVar31 = ((int)uVar31 < (int)uVar58) * uVar58 |
                             ((int)uVar31 >= (int)uVar58) * uVar31;
                    uVar32 = ((int)uVar32 < (int)uVar60) * uVar60 |
                             ((int)uVar32 >= (int)uVar60) * uVar32;
                    uVar33 = ((int)uVar33 < (int)uVar62) * uVar62 |
                             ((int)uVar33 >= (int)uVar62) * uVar33;
                    uVar37 = (uint)(iVar64 < (int)uVar37) * iVar64 |
                             (iVar64 >= (int)uVar37) * uVar37;
                    uVar39 = (uint)(iVar66 < (int)uVar39) * iVar66 |
                             (iVar66 >= (int)uVar39) * uVar39;
                    uVar40 = (uint)(iVar67 < (int)uVar40) * iVar67 |
                             (iVar67 >= (int)uVar40) * uVar40;
                    uVar41 = (uint)(iVar68 < (int)uVar41) * iVar68 |
                             (iVar68 >= (int)uVar41) * uVar41;
                    piVar1 = ((ppVar10->field_4).rowcols)->score_row;
                    *(uint *)((long)piVar1 + lVar15) = uVar55;
                    *(uint *)((long)piVar1 + lVar21 * 4 + lVar15) = uVar58;
                    *(uint *)((long)piVar1 + lVar21 * 8 + lVar15) = uVar60;
                    *(uint *)((long)piVar1 + lVar21 * 0xc + lVar15) = uVar62;
                    uVar37 = ((int)uVar42 < (int)uVar37) * uVar42 |
                             ((int)uVar42 >= (int)uVar37) * uVar37;
                    uVar39 = ((int)uVar44 < (int)uVar39) * uVar44 |
                             ((int)uVar44 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar45 < (int)uVar40) * uVar45 |
                             ((int)uVar45 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar46 < (int)uVar41) * uVar46 |
                             ((int)uVar46 >= (int)uVar41) * uVar41;
                    uVar37 = ((int)uVar55 < (int)uVar37) * uVar55 |
                             ((int)uVar55 >= (int)uVar37) * uVar37;
                    uVar39 = ((int)uVar58 < (int)uVar39) * uVar58 |
                             ((int)uVar58 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar60 < (int)uVar40) * uVar60 |
                             ((int)uVar60 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar62 < (int)uVar41) * uVar62 |
                             ((int)uVar62 >= (int)uVar41) * uVar41;
                    iVar47 = uVar55 - open;
                    iVar59 = uVar58 - open;
                    iVar61 = uVar60 - open;
                    iVar63 = uVar62 - open;
                    iVar64 = iVar64 - gap;
                    iVar66 = iVar66 - gap;
                    iVar67 = iVar67 - gap;
                    iVar68 = iVar68 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar17);
                    *puVar2 = (uint)(iVar64 < iVar47) * iVar47 | (uint)(iVar64 >= iVar47) * iVar64;
                    puVar2[1] = (uint)(iVar66 < iVar59) * iVar59 | (uint)(iVar66 >= iVar59) * iVar66
                    ;
                    puVar2[2] = (uint)(iVar67 < iVar61) * iVar61 | (uint)(iVar67 >= iVar61) * iVar67
                    ;
                    puVar2[3] = (uint)(iVar68 < iVar63) * iVar63 | (uint)(iVar68 >= iVar63) * iVar68
                    ;
                    iVar23 = uVar42 - gap;
                    iVar51 = uVar44 - gap;
                    iVar53 = uVar45 - gap;
                    iVar64 = uVar46 - gap;
                    uVar42 = (uint)(iVar23 < iVar47) * iVar47 | (uint)(iVar23 >= iVar47) * iVar23;
                    uVar44 = (uint)(iVar51 < iVar59) * iVar59 | (uint)(iVar51 >= iVar59) * iVar51;
                    uVar45 = (uint)(iVar53 < iVar61) * iVar61 | (uint)(iVar53 >= iVar61) * iVar53;
                    uVar46 = (uint)(iVar64 < iVar63) * iVar63 | (uint)(iVar64 >= iVar63) * iVar64;
                    piVar1 = (int *)((long)*ptr + lVar17);
                    iVar48 = *piVar1;
                    iVar23 = piVar1[1];
                    iVar51 = piVar1[2];
                    iVar53 = piVar1[3];
                    lVar17 = lVar17 + 0x10;
                    lVar15 = lVar15 + uVar36 * 4;
                  } while (size << 4 != lVar17);
                  iVar23 = 0;
                  do {
                    lVar17 = 0;
                    lVar15 = lVar12;
                    uVar46 = ptr_01[uVar14 + 1] - open;
                    uVar55 = uVar42;
                    uVar58 = uVar44;
                    uVar60 = uVar45;
                    do {
                      piVar1 = (int *)((long)*palVar16 + lVar17);
                      iVar51 = *piVar1;
                      iVar53 = piVar1[1];
                      iVar3 = piVar1[2];
                      iVar64 = piVar1[3];
                      uVar62 = (iVar51 < (int)uVar46) * uVar46 |
                               (uint)(iVar51 >= (int)uVar46) * iVar51;
                      uVar50 = (iVar53 < (int)uVar55) * uVar55 |
                               (uint)(iVar53 >= (int)uVar55) * iVar53;
                      uVar52 = (iVar3 < (int)uVar58) * uVar58 | (uint)(iVar3 >= (int)uVar58) * iVar3
                      ;
                      uVar54 = (iVar64 < (int)uVar60) * uVar60 |
                               (uint)(iVar64 >= (int)uVar60) * iVar64;
                      puVar2 = (uint *)((long)*palVar16 + lVar17);
                      *puVar2 = uVar62;
                      puVar2[1] = uVar50;
                      puVar2[2] = uVar52;
                      puVar2[3] = uVar54;
                      piVar1 = ((ppVar10->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar15) = uVar62;
                      lVar20 = (long)piVar1 + lVar15;
                      *(uint *)(lVar21 * 4 + lVar20) = uVar50;
                      *(uint *)(lVar21 * 8 + lVar20) = uVar52;
                      *(uint *)(lVar21 * 0xc + lVar20) = uVar54;
                      uVar37 = ((int)uVar62 < (int)uVar37) * uVar62 |
                               ((int)uVar62 >= (int)uVar37) * uVar37;
                      uVar39 = ((int)uVar50 < (int)uVar39) * uVar50 |
                               ((int)uVar50 >= (int)uVar39) * uVar39;
                      uVar40 = ((int)uVar52 < (int)uVar40) * uVar52 |
                               ((int)uVar52 >= (int)uVar40) * uVar40;
                      uVar41 = ((int)uVar54 < (int)uVar41) * uVar54 |
                               ((int)uVar54 >= (int)uVar41) * uVar41;
                      uVar24 = ((int)uVar24 < (int)uVar62) * uVar62 |
                               ((int)uVar24 >= (int)uVar62) * uVar24;
                      uVar31 = ((int)uVar31 < (int)uVar50) * uVar50 |
                               ((int)uVar31 >= (int)uVar50) * uVar31;
                      uVar32 = ((int)uVar32 < (int)uVar52) * uVar52 |
                               ((int)uVar32 >= (int)uVar52) * uVar32;
                      uVar33 = ((int)uVar33 < (int)uVar54) * uVar54 |
                               ((int)uVar33 >= (int)uVar54) * uVar33;
                      uVar42 = uVar46 - gap;
                      uVar44 = uVar55 - gap;
                      uVar45 = uVar58 - gap;
                      uVar60 = uVar60 - gap;
                      auVar57._0_4_ = -(uint)((int)(uVar62 - open) < (int)uVar42);
                      auVar57._4_4_ = -(uint)((int)(uVar50 - open) < (int)uVar44);
                      auVar57._8_4_ = -(uint)((int)(uVar52 - open) < (int)uVar45);
                      auVar57._12_4_ = -(uint)((int)(uVar54 - open) < (int)uVar60);
                      iVar51 = movmskps((int)lVar20,auVar57);
                      if (iVar51 == 0) goto LAB_006c5558;
                      lVar17 = lVar17 + 0x10;
                      lVar15 = lVar15 + uVar36 * 4;
                      uVar46 = uVar42;
                      uVar55 = uVar44;
                      uVar58 = uVar45;
                    } while (size << 4 != lVar17);
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != 4);
LAB_006c5558:
                  uVar14 = uVar14 + 1;
                  lVar12 = lVar12 + 4;
                  palVar11 = palVar16;
                  if (uVar14 == uVar36) {
                    uVar36 = palVar16[uVar35][1];
                    iVar23 = (int)uVar35 * 0x10;
                    if (iVar13 < 3) {
                      iVar13 = 0;
                      uVar35 = palVar16[uVar35][0];
                      do {
                        uVar36 = uVar36 << 0x20 | uVar35 >> 0x20;
                        iVar13 = iVar13 + 1;
                        uVar35 = uVar35 << 0x20;
                        iVar23 = iVar9;
                      } while (iVar13 < iVar9);
                    }
                    auVar34._0_4_ = -(uint)((int)uVar37 < (int)uVar18);
                    auVar34._4_4_ = -(uint)((int)uVar39 < (int)uVar18);
                    auVar34._8_4_ = -(uint)((int)uVar40 < (int)uVar18);
                    auVar34._12_4_ = -(uint)((int)uVar41 < (int)uVar18);
                    auVar30._0_4_ = -(uint)((int)uVar7 < (int)uVar24);
                    auVar30._4_4_ = -(uint)((int)uVar7 < (int)uVar31);
                    auVar30._8_4_ = -(uint)((int)uVar7 < (int)uVar32);
                    auVar30._12_4_ = -(uint)((int)uVar7 < (int)uVar33);
                    iVar13 = movmskps(iVar23,auVar30 | auVar34);
                    if (iVar13 == 0) {
                      iVar13 = (int)(uVar36 >> 0x20);
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      iVar13 = 0;
                      iVar8 = 0;
                      uVar22 = 0;
                    }
                    ppVar10->score = iVar13;
                    ppVar10->end_query = uVar22;
                    ppVar10->end_ref = iVar8;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar16);
                    return ppVar10;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}